

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

Names * __thiscall
cmGeneratorTarget::GetExecutableNames
          (Names *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  cmMakefile *this_00;
  bool bVar1;
  TargetType TVar2;
  string *psVar3;
  cmValue cVar4;
  NameComponents *__lhs;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Names::Names(__return_storage_ptr__);
  bVar1 = IsImported(this);
  if (bVar1) {
    psVar3 = GetName_abi_cxx11_(this);
    cmStrCat<char_const(&)[47],std::__cxx11::string_const&>
              (&msg,(char (*) [47])"GetExecutableNames called on imported target: ",psVar3);
    cmLocalGenerator::IssueMessage(this->LocalGenerator,INTERNAL_ERROR,&msg);
    std::__cxx11::string::~string((string *)&msg);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&msg,"VERSION",(allocator<char> *)&local_50);
  cVar4 = GetProperty(this,&msg);
  std::__cxx11::string::~string((string *)&msg);
  TVar2 = GetType(this);
  if (TVar2 == EXECUTABLE) {
    this_00 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&msg,"XCODE",(allocator<char> *)&local_50);
    bVar1 = cmMakefile::IsOn(this_00,&msg);
    std::__cxx11::string::~string((string *)&msg);
    if (!bVar1) goto LAB_00494798;
  }
  cVar4.Value = (string *)0x0;
LAB_00494798:
  __lhs = GetFullNameInternalComponents(this,config,RuntimeBinaryArtifact);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  std::operator+(&local_50,&__lhs->prefix,&__return_storage_ptr__->Base);
  std::operator+(&msg,&local_50,&__lhs->suffix);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->Output,(string *)&msg);
  std::__cxx11::string::~string((string *)&msg);
  std::__cxx11::string::~string((string *)&local_50);
  psVar3 = &__return_storage_ptr__->Real;
  std::__cxx11::string::_M_assign((string *)psVar3);
  if (cVar4.Value != (string *)0x0) {
    std::__cxx11::string::append((char *)psVar3);
    std::__cxx11::string::append((string *)psVar3);
  }
  GetFullNameInternal(&msg,this,config,ImportLibraryArtifact);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->ImportLibrary,(string *)&msg);
  std::__cxx11::string::~string((string *)&msg);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->ImportReal);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->ImportOutput);
  GetPDBName(&msg,this,config);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->PDB,(string *)&msg);
  std::__cxx11::string::~string((string *)&msg);
  return __return_storage_ptr__;
}

Assistant:

cmGeneratorTarget::Names cmGeneratorTarget::GetExecutableNames(
  const std::string& config) const
{
  cmGeneratorTarget::Names targetNames;

  // This should not be called for imported targets.
  // TODO: Split cmTarget into a class hierarchy to get compile-time
  // enforcement of the limited imported target API.
  if (this->IsImported()) {
    std::string msg = cmStrCat(
      "GetExecutableNames called on imported target: ", this->GetName());
    this->LocalGenerator->IssueMessage(MessageType::INTERNAL_ERROR, msg);
  }

// This versioning is supported only for executables and then only
// when the platform supports symbolic links.
#if defined(_WIN32) && !defined(__CYGWIN__)
  cmValue version;
#else
  // Check for executable version properties.
  cmValue version = this->GetProperty("VERSION");
  if (this->GetType() != cmStateEnums::EXECUTABLE ||
      this->Makefile->IsOn("XCODE")) {
    version = nullptr;
  }
#endif

  // Get the components of the executable name.
  NameComponents const& components = this->GetFullNameInternalComponents(
    config, cmStateEnums::RuntimeBinaryArtifact);

  // The executable name.
  targetNames.Base = components.base;
  targetNames.Output =
    components.prefix + targetNames.Base + components.suffix;

// The executable's real name on disk.
#if defined(__CYGWIN__)
  targetNames.Real = components.prefix + targetNames.Base;
#else
  targetNames.Real = targetNames.Output;
#endif
  if (version) {
    targetNames.Real += "-";
    targetNames.Real += *version;
  }
#if defined(__CYGWIN__)
  targetNames.Real += components.suffix;
#endif

  // The import library name.
  targetNames.ImportLibrary =
    this->GetFullNameInternal(config, cmStateEnums::ImportLibraryArtifact);
  targetNames.ImportReal = targetNames.ImportLibrary;
  targetNames.ImportOutput = targetNames.ImportLibrary;

  // The program database file name.
  targetNames.PDB = this->GetPDBName(config);

  return targetNames;
}